

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

wchar_t archive_string_normalize_C(archive_string *as,void *_p,size_t len,archive_string_conv *sc)

{
  char *pcVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  int iVar4;
  uint32_t uVar5;
  archive_string *paVar6;
  size_t sVar7;
  long lVar8;
  int iVar9;
  bool bVar10;
  wchar_t local_16c;
  wchar_t local_160;
  wchar_t local_15c;
  wchar_t local_14c;
  wchar_t local_12c;
  wchar_t local_128;
  wchar_t _i_1;
  wchar_t j;
  wchar_t _i;
  wchar_t TIndex;
  wchar_t VIndex;
  uint32_t nfc;
  wchar_t SIndex;
  wchar_t LIndex;
  wchar_t ucx_size;
  wchar_t nx;
  wchar_t i;
  wchar_t cx;
  wchar_t cl;
  wchar_t ccx [10];
  uint local_c8 [2];
  uint32_t ucx [10];
  char *local_98;
  char *uc2ptr;
  char *ucptr;
  _func_size_t_char_ptr_size_t_uint32_t *unparse;
  _func_wchar_t_uint32_t_ptr_char_ptr_size_t *parse;
  int local_70;
  wchar_t tm;
  wchar_t ts;
  wchar_t spair;
  wchar_t ret;
  wchar_t n2;
  wchar_t n;
  wchar_t always_replace;
  size_t w;
  uint32_t uc2;
  uint32_t uc;
  char *endp;
  char *p;
  char *s;
  archive_string_conv *sc_local;
  size_t len_local;
  void *_p_local;
  archive_string *as_local;
  
  ts = L'\0';
  local_70 = 1;
  if ((sc->flag & 0x400U) == 0) {
    if ((sc->flag & 0x1000U) == 0) {
      if ((sc->flag & 0x100U) == 0) {
        bVar10 = false;
        if ((sc->flag & 0x800U) == 0) {
          if ((sc->flag & 0x2000U) == 0) {
            ucptr = (char *)unicode_to_utf8;
          }
          else {
            ucptr = (char *)unicode_to_utf16le;
            local_70 = 2;
          }
        }
        else {
          ucptr = (char *)unicode_to_utf16be;
          local_70 = 2;
        }
      }
      else {
        ucptr = (char *)unicode_to_utf8;
        bVar10 = (sc->flag & 0x200U) == 0;
      }
    }
    else {
      ucptr = (char *)unicode_to_utf16le;
      local_70 = 2;
      bVar10 = (sc->flag & 0x2000U) == 0;
    }
  }
  else {
    ucptr = (char *)unicode_to_utf16be;
    local_70 = 2;
    bVar10 = (sc->flag & 0x800U) == 0;
  }
  if ((sc->flag & 0x800U) == 0) {
    if ((sc->flag & 0x2000U) == 0) {
      unparse = cesu8_to_unicode;
      parse._4_4_ = local_70;
      tm = L'\x06';
    }
    else {
      unparse = utf16le_to_unicode;
      parse._4_4_ = 1;
      tm = L'\x04';
    }
  }
  else {
    unparse = utf16be_to_unicode;
    parse._4_4_ = 1;
    tm = L'\x04';
  }
  p = (char *)_p;
  s = (char *)sc;
  sc_local = (archive_string_conv *)len;
  len_local = (size_t)_p;
  _p_local = as;
  paVar6 = archive_string_ensure(as,as->length + len * (long)parse._4_4_ + (long)local_70);
  if (paVar6 == (archive_string *)0x0) {
    return L'\xffffffff';
  }
  endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
  _uc2 = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - (long)local_70);
LAB_00639b3f:
  while( true ) {
    sVar7 = (*unparse)((char *)((long)&w + 4),(size_t)p,(uint32_t)sc_local);
    ret = (wchar_t)sVar7;
    if (ret == L'\0') break;
    if (L'\xffffffff' < ret) {
      if ((ret == tm) || (bVar10)) {
        uc2ptr = (char *)0x0;
      }
      else {
        uc2ptr = p;
      }
      p = p + ret;
      sc_local = (archive_string_conv *)((long)sc_local - (long)ret);
      while( true ) {
        sVar7 = (*unparse)((char *)&w,(size_t)p,(uint32_t)sc_local);
        wVar3 = (wchar_t)sVar7;
        if (wVar3 < L'\x01') break;
        if ((wVar3 == tm) || (bVar10)) {
          local_98 = (char *)0x0;
        }
        else {
          local_98 = p;
        }
        p = p + wVar3;
        sc_local = (archive_string_conv *)((long)sc_local - (long)wVar3);
        if (((uint32_t)w >> 8 < 0x1d3) && (""[(uint32_t)w >> 8] != '\0')) {
          iVar9 = w._4_4_ - 0x1100;
          if ((iVar9 < 0) || (0x12 < iVar9)) {
            iVar9 = w._4_4_ - 0xac00;
            if ((iVar9 < 0) || ((0x2ba3 < iVar9 || (iVar9 % 0x1c != 0)))) {
              uVar5 = get_nfc(w._4_4_,(uint32_t)w);
              if (uVar5 == 0) {
                if ((uint32_t)w < 0x1d245) {
                  local_14c = (wchar_t)ccc_val[ccc_val_index[""[(uint32_t)w >> 8]]
                                               [(uint32_t)w >> 4 & 0xf]][(uint32_t)w & 0xf];
                }
                else {
                  local_14c = L'\0';
                }
                i = local_14c;
                if (local_14c != L'\0') {
                  nx = L'\0';
                  local_c8[0] = (uint32_t)w;
                  cx = local_14c;
                  _i_1 = L'\x01';
                  goto LAB_0063a872;
                }
                if (uc2ptr == (char *)0x0) {
                  while (lVar8 = (*(code *)ucptr)(endp,(long)_uc2 - (long)endp,w._4_4_), lVar8 == 0)
                  {
                    *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
                    paVar6 = archive_string_ensure
                                       ((archive_string *)_p_local,
                                        *(long *)((long)_p_local + 0x10) +
                                        (long)sc_local * (long)parse._4_4_ + (long)local_70);
                    if (paVar6 == (archive_string *)0x0) {
                      return L'\xffffffff';
                    }
                    endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
                    _uc2 = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - (long)local_70)
                    ;
                  }
                  endp = endp + lVar8;
                }
                else {
                  if (_uc2 < endp + ret) {
                    *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
                    paVar6 = archive_string_ensure
                                       ((archive_string *)_p_local,
                                        *(long *)((long)_p_local + 0x10) +
                                        (long)sc_local * (long)parse._4_4_ + (long)local_70);
                    if (paVar6 == (archive_string *)0x0) {
                      return L'\xffffffff';
                    }
                    endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
                    _uc2 = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - (long)local_70)
                    ;
                  }
                  switch(ret) {
                  case L'\x04':
                    *endp = *uc2ptr;
                    uc2ptr = uc2ptr + 1;
                    endp = endp + 1;
                  case L'\x03':
                    *endp = *uc2ptr;
                    uc2ptr = uc2ptr + 1;
                    endp = endp + 1;
                  case L'\x02':
                    *endp = *uc2ptr;
                    uc2ptr = uc2ptr + 1;
                    endp = endp + 1;
                  case L'\x01':
                    *endp = *uc2ptr;
                    endp = endp + 1;
                  }
                }
                w._4_4_ = (uint32_t)w;
                uc2ptr = local_98;
                ret = wVar3;
              }
              else {
                uc2ptr = (char *)0x0;
                w._4_4_ = uVar5;
              }
            }
            else {
              iVar9 = (uint32_t)w - 0x11a7;
              if ((iVar9 < 1) || (0x1b < iVar9)) {
                if (uc2ptr == (char *)0x0) {
                  while (lVar8 = (*(code *)ucptr)(endp,(long)_uc2 - (long)endp,w._4_4_), lVar8 == 0)
                  {
                    *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
                    paVar6 = archive_string_ensure
                                       ((archive_string *)_p_local,
                                        *(long *)((long)_p_local + 0x10) +
                                        (long)sc_local * (long)parse._4_4_ + (long)local_70);
                    if (paVar6 == (archive_string *)0x0) {
                      return L'\xffffffff';
                    }
                    endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
                    _uc2 = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - (long)local_70)
                    ;
                  }
                  endp = endp + lVar8;
                }
                else {
                  if (_uc2 < endp + ret) {
                    *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
                    paVar6 = archive_string_ensure
                                       ((archive_string *)_p_local,
                                        *(long *)((long)_p_local + 0x10) +
                                        (long)sc_local * (long)parse._4_4_ + (long)local_70);
                    if (paVar6 == (archive_string *)0x0) {
                      return L'\xffffffff';
                    }
                    endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
                    _uc2 = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - (long)local_70)
                    ;
                  }
                  switch(ret) {
                  case L'\x04':
                    *endp = *uc2ptr;
                    uc2ptr = uc2ptr + 1;
                    endp = endp + 1;
                  case L'\x03':
                    *endp = *uc2ptr;
                    uc2ptr = uc2ptr + 1;
                    endp = endp + 1;
                  case L'\x02':
                    *endp = *uc2ptr;
                    uc2ptr = uc2ptr + 1;
                    endp = endp + 1;
                  case L'\x01':
                    *endp = *uc2ptr;
                    endp = endp + 1;
                  }
                }
                w._4_4_ = (uint32_t)w;
                uc2ptr = local_98;
                ret = wVar3;
              }
              else {
                w._4_4_ = w._4_4_ + iVar9;
                uc2ptr = (char *)0x0;
              }
            }
          }
          else {
            iVar4 = (uint32_t)w - 0x1161;
            if ((iVar4 < 0) || (0x14 < iVar4)) {
              if (uc2ptr == (char *)0x0) {
                while (lVar8 = (*(code *)ucptr)(endp,(long)_uc2 - (long)endp,w._4_4_), lVar8 == 0) {
                  *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
                  paVar6 = archive_string_ensure
                                     ((archive_string *)_p_local,
                                      *(long *)((long)_p_local + 0x10) +
                                      (long)sc_local * (long)parse._4_4_ + (long)local_70);
                  if (paVar6 == (archive_string *)0x0) {
                    return L'\xffffffff';
                  }
                  endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
                  _uc2 = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - (long)local_70);
                }
                endp = endp + lVar8;
              }
              else {
                if (_uc2 < endp + ret) {
                  *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
                  paVar6 = archive_string_ensure
                                     ((archive_string *)_p_local,
                                      *(long *)((long)_p_local + 0x10) +
                                      (long)sc_local * (long)parse._4_4_ + (long)local_70);
                  if (paVar6 == (archive_string *)0x0) {
                    return L'\xffffffff';
                  }
                  endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
                  _uc2 = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - (long)local_70);
                }
                switch(ret) {
                case L'\x04':
                  *endp = *uc2ptr;
                  uc2ptr = uc2ptr + 1;
                  endp = endp + 1;
                case L'\x03':
                  *endp = *uc2ptr;
                  uc2ptr = uc2ptr + 1;
                  endp = endp + 1;
                case L'\x02':
                  *endp = *uc2ptr;
                  uc2ptr = uc2ptr + 1;
                  endp = endp + 1;
                case L'\x01':
                  *endp = *uc2ptr;
                  endp = endp + 1;
                }
              }
              w._4_4_ = (uint32_t)w;
              uc2ptr = local_98;
              ret = wVar3;
            }
            else {
              w._4_4_ = (iVar9 * 0x15 + iVar4) * 0x1c + 0xac00;
              uc2ptr = (char *)0x0;
            }
          }
        }
        else {
          if (uc2ptr == (char *)0x0) {
            while (lVar8 = (*(code *)ucptr)(endp,(long)_uc2 - (long)endp,w._4_4_), lVar8 == 0) {
              *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
              paVar6 = archive_string_ensure
                                 ((archive_string *)_p_local,
                                  *(long *)((long)_p_local + 0x10) +
                                  (long)sc_local * (long)parse._4_4_ + (long)local_70);
              if (paVar6 == (archive_string *)0x0) {
                return L'\xffffffff';
              }
              endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
              _uc2 = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - (long)local_70);
            }
            endp = endp + lVar8;
          }
          else {
            if (_uc2 < endp + ret) {
              *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
              paVar6 = archive_string_ensure
                                 ((archive_string *)_p_local,
                                  *(long *)((long)_p_local + 0x10) +
                                  (long)sc_local * (long)parse._4_4_ + (long)local_70);
              if (paVar6 == (archive_string *)0x0) {
                return L'\xffffffff';
              }
              endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
              _uc2 = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - (long)local_70);
            }
            switch(ret) {
            case L'\x04':
              *endp = *uc2ptr;
              uc2ptr = uc2ptr + 1;
              endp = endp + 1;
            case L'\x03':
              *endp = *uc2ptr;
              uc2ptr = uc2ptr + 1;
              endp = endp + 1;
            case L'\x02':
              *endp = *uc2ptr;
              uc2ptr = uc2ptr + 1;
              endp = endp + 1;
            case L'\x01':
              *endp = *uc2ptr;
              endp = endp + 1;
            }
          }
          uc2ptr = local_98;
          ret = wVar3;
          w._4_4_ = (uint32_t)w;
        }
      }
      goto LAB_0063b1fd;
    }
    while (lVar8 = (*(code *)ucptr)(endp,(long)_uc2 - (long)endp,w._4_4_), lVar8 == 0) {
      *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
      paVar6 = archive_string_ensure
                         ((archive_string *)_p_local,
                          *(long *)((long)_p_local + 0x10) + (long)sc_local * (long)parse._4_4_ +
                          (long)local_70);
      if (paVar6 == (archive_string *)0x0) {
        return L'\xffffffff';
      }
      endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
      _uc2 = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - (long)local_70);
    }
    endp = endp + lVar8;
    p = p + -ret;
    sc_local = (archive_string_conv *)((long)sc_local - (long)-ret);
    ts = L'\xffffffff';
  }
  goto switchD_0063b611_default;
LAB_0063a872:
  if (L'\t' < _i_1) goto LAB_0063a9d9;
  sVar7 = (*unparse)((char *)(local_c8 + _i_1),(size_t)p,(uint32_t)sc_local);
  LIndex = (wchar_t)sVar7;
  if (LIndex < L'\x01') goto LAB_0063a9d9;
  if (local_c8[_i_1] < 0x1d245) {
    local_15c = (wchar_t)ccc_val[ccc_val_index[""[local_c8[_i_1] >> 8]][local_c8[_i_1] >> 4 & 0xf]]
                         [local_c8[_i_1] & 0xf];
  }
  else {
    local_15c = L'\0';
  }
  nx = local_15c;
  if ((((uint)local_15c <= (uint)i) && (i != L'ä')) && (local_15c != L'ä')) goto LAB_0063a9d9;
  p = p + LIndex;
  sc_local = (archive_string_conv *)((long)sc_local - (long)LIndex);
  i = local_15c;
  (&cx)[_i_1] = local_15c;
  _i_1 = _i_1 + L'\x01';
  goto LAB_0063a872;
LAB_0063a9d9:
  if (_i_1 < L'\n') {
    SIndex = _i_1;
  }
  else {
    ts = L'\xffffffff';
    SIndex = L'\n';
  }
  ucx_size = L'\x01';
  while (ucx_size < SIndex) {
    uVar5 = get_nfc(w._4_4_,local_c8[ucx_size]);
    if (uVar5 == 0) {
      ucx_size = ucx_size + L'\x01';
    }
    else {
      w._4_4_ = uVar5;
      uc2ptr = (char *)0x0;
      for (local_128 = ucx_size; local_128 + L'\x01' < SIndex; local_128 = local_128 + L'\x01') {
        local_c8[local_128] = local_c8[local_128 + L'\x01'];
        (&cx)[local_128] = (&cx)[local_128 + L'\x01'];
      }
      local_12c = SIndex + L'\xffffffff';
      wVar2 = local_12c;
      if (((L'\0' < local_12c) && (wVar2 = local_12c, ucx_size == local_12c)) &&
         ((wVar2 = local_12c, L'\0' < LIndex && (wVar2 = local_12c, nx == i)))) {
        i = (&cx)[SIndex + L'\xfffffffe'];
        for (; local_12c < L'\n'; local_12c = local_12c + L'\x01') {
          sVar7 = (*unparse)((char *)(local_c8 + local_12c),(size_t)p,(uint32_t)sc_local);
          LIndex = (wchar_t)sVar7;
          if (LIndex < L'\x01') break;
          if (local_c8[local_12c] < 0x1d245) {
            local_160 = (wchar_t)ccc_val[ccc_val_index[""[local_c8[local_12c] >> 8]]
                                         [local_c8[local_12c] >> 4 & 0xf]]
                                 [local_c8[local_12c] & 0xf];
          }
          else {
            local_160 = L'\0';
          }
          nx = local_160;
          if (((local_160 <= i) && (i != L'ä')) && (local_160 != L'ä')) break;
          p = p + LIndex;
          sc_local = (archive_string_conv *)((long)sc_local - (long)LIndex);
          i = local_160;
          (&cx)[local_12c] = local_160;
        }
        if (local_12c < L'\n') {
          SIndex = local_12c;
          wVar2 = SIndex;
        }
        else {
          ts = L'\xffffffff';
          SIndex = L'\n';
          wVar2 = SIndex;
        }
      }
      SIndex = wVar2;
      ucx_size = L'\0';
    }
  }
  if (uc2ptr == (char *)0x0) {
    while (lVar8 = (*(code *)ucptr)(endp,(long)_uc2 - (long)endp,w._4_4_), lVar8 == 0) {
      *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
      paVar6 = archive_string_ensure
                         ((archive_string *)_p_local,
                          *(long *)((long)_p_local + 0x10) + (long)sc_local * (long)parse._4_4_ +
                          (long)local_70);
      if (paVar6 == (archive_string *)0x0) {
        return L'\xffffffff';
      }
      endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
      _uc2 = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - (long)local_70);
    }
    endp = endp + lVar8;
  }
  else {
    if (_uc2 < endp + ret) {
      *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
      paVar6 = archive_string_ensure
                         ((archive_string *)_p_local,
                          *(long *)((long)_p_local + 0x10) + (long)sc_local * (long)parse._4_4_ +
                          (long)local_70);
      if (paVar6 == (archive_string *)0x0) {
        return L'\xffffffff';
      }
      endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
      _uc2 = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - (long)local_70);
    }
    switch(ret) {
    case L'\x04':
      *endp = *uc2ptr;
      uc2ptr = uc2ptr + 1;
      endp = endp + 1;
    case L'\x03':
      *endp = *uc2ptr;
      uc2ptr = uc2ptr + 1;
      endp = endp + 1;
    case L'\x02':
      *endp = *uc2ptr;
      uc2ptr = uc2ptr + 1;
      endp = endp + 1;
    case L'\x01':
      pcVar1 = endp;
      endp = endp + 1;
      *pcVar1 = *uc2ptr;
    default:
      uc2ptr = (char *)0x0;
    }
  }
  for (ucx_size = L'\0'; ucx_size < SIndex; ucx_size = ucx_size + L'\x01') {
    while (lVar8 = (*(code *)ucptr)(endp,(long)_uc2 - (long)endp,local_c8[ucx_size]), lVar8 == 0) {
      *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
      paVar6 = archive_string_ensure
                         ((archive_string *)_p_local,
                          *(long *)((long)_p_local + 0x10) + (long)sc_local * (long)parse._4_4_ +
                          (long)local_70);
      if (paVar6 == (archive_string *)0x0) {
        return L'\xffffffff';
      }
      endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
      _uc2 = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - (long)local_70);
    }
    endp = endp + lVar8;
  }
  if (((L'\0' < LIndex) && (nx == i)) && (sc_local != (archive_string_conv *)0x0)) {
    while( true ) {
      sVar7 = (*unparse)((char *)local_c8,(size_t)p,(uint32_t)sc_local);
      LIndex = (wchar_t)sVar7;
      if (LIndex < L'\x01') break;
      if (local_c8[0] < 0x1d245) {
        local_16c = (wchar_t)ccc_val[ccc_val_index[""[local_c8[0] >> 8]][local_c8[0] >> 4 & 0xf]]
                             [local_c8[0] & 0xf];
      }
      else {
        local_16c = L'\0';
      }
      if (local_16c < i) break;
      p = p + LIndex;
      sc_local = (archive_string_conv *)((long)sc_local - (long)LIndex);
      i = local_16c;
      while (lVar8 = (*(code *)ucptr)(endp,(long)_uc2 - (long)endp,local_c8[0]), lVar8 == 0) {
        *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
        paVar6 = archive_string_ensure
                           ((archive_string *)_p_local,
                            *(long *)((long)_p_local + 0x10) + (long)sc_local * (long)parse._4_4_ +
                            (long)local_70);
        if (paVar6 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
        _uc2 = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - (long)local_70);
      }
      endp = endp + lVar8;
    }
  }
LAB_0063b1fd:
  if (wVar3 < L'\0') {
    if (uc2ptr == (char *)0x0) {
      while (lVar8 = (*(code *)ucptr)(endp,(long)_uc2 - (long)endp,w._4_4_), lVar8 == 0) {
        *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
        paVar6 = archive_string_ensure
                           ((archive_string *)_p_local,
                            *(long *)((long)_p_local + 0x10) + (long)sc_local * (long)parse._4_4_ +
                            (long)local_70);
        if (paVar6 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
        _uc2 = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - (long)local_70);
      }
      endp = endp + lVar8;
    }
    else {
      if (_uc2 < endp + ret) {
        *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
        paVar6 = archive_string_ensure
                           ((archive_string *)_p_local,
                            *(long *)((long)_p_local + 0x10) + (long)sc_local * (long)parse._4_4_ +
                            (long)local_70);
        if (paVar6 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
        _uc2 = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - (long)local_70);
      }
      switch(ret) {
      case L'\x04':
        *endp = *uc2ptr;
        uc2ptr = uc2ptr + 1;
        endp = endp + 1;
      case L'\x03':
        *endp = *uc2ptr;
        uc2ptr = uc2ptr + 1;
        endp = endp + 1;
      case L'\x02':
        *endp = *uc2ptr;
        uc2ptr = uc2ptr + 1;
        endp = endp + 1;
      case L'\x01':
        *endp = *uc2ptr;
        endp = endp + 1;
      }
    }
    while (lVar8 = (*(code *)ucptr)(endp,(long)_uc2 - (long)endp,(uint32_t)w), lVar8 == 0) {
      *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
      paVar6 = archive_string_ensure
                         ((archive_string *)_p_local,
                          *(long *)((long)_p_local + 0x10) + (long)sc_local * (long)parse._4_4_ +
                          (long)local_70);
      if (paVar6 == (archive_string *)0x0) {
        return L'\xffffffff';
      }
      _uc2 = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - (long)local_70);
      endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
    }
    endp = endp + lVar8;
    p = p + -wVar3;
    sc_local = (archive_string_conv *)((long)sc_local - (long)-wVar3);
    ts = L'\xffffffff';
  }
  else if (wVar3 == L'\0') {
    if (uc2ptr == (char *)0x0) {
      while (lVar8 = (*(code *)ucptr)(endp,(long)_uc2 - (long)endp,w._4_4_), lVar8 == 0) {
        *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
        paVar6 = archive_string_ensure
                           ((archive_string *)_p_local,
                            *(long *)((long)_p_local + 0x10) + (long)sc_local * (long)parse._4_4_ +
                            (long)local_70);
        if (paVar6 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
        _uc2 = (char *)((*_p_local + *(long *)((long)_p_local + 0x10)) - (long)local_70);
      }
      endp = endp + lVar8;
    }
    else {
      if (_uc2 < endp + ret) {
        *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
        paVar6 = archive_string_ensure
                           ((archive_string *)_p_local,
                            *(long *)((long)_p_local + 0x10) + (long)sc_local * (long)parse._4_4_ +
                            (long)local_70);
        if (paVar6 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        endp = (char *)(*_p_local + *(long *)((long)_p_local + 8));
      }
      switch(ret) {
      case L'\x04':
        *endp = *uc2ptr;
        uc2ptr = uc2ptr + 1;
        endp = endp + 1;
      case L'\x03':
        *endp = *uc2ptr;
        uc2ptr = uc2ptr + 1;
        endp = endp + 1;
      case L'\x02':
        *endp = *uc2ptr;
        uc2ptr = uc2ptr + 1;
        endp = endp + 1;
      case L'\x01':
        *endp = *uc2ptr;
        endp = endp + 1;
      }
    }
switchD_0063b611_default:
    *(long *)((long)_p_local + 8) = (long)endp - *_p_local;
    *(undefined1 *)(*_p_local + *(long *)((long)_p_local + 8)) = 0;
    if (local_70 == 2) {
      *(undefined1 *)(*_p_local + 1 + *(long *)((long)_p_local + 8)) = 0;
    }
    return ts;
  }
  goto LAB_00639b3f;
}

Assistant:

static int
archive_string_normalize_C(struct archive_string *as, const void *_p,
    size_t len, struct archive_string_conv *sc)
{
	const char *s = (const char *)_p;
	char *p, *endp;
	uint32_t uc, uc2;
	size_t w;
	int always_replace, n, n2, ret = 0, spair, ts, tm;
	int (*parse)(uint32_t *, const char *, size_t);
	size_t (*unparse)(char *, size_t, uint32_t);

	always_replace = 1;
	ts = 1;/* text size. */
	if (sc->flag & SCONV_TO_UTF16BE) {
		unparse = unicode_to_utf16be;
		ts = 2;
		if (sc->flag & SCONV_FROM_UTF16BE)
			always_replace = 0;
	} else if (sc->flag & SCONV_TO_UTF16LE) {
		unparse = unicode_to_utf16le;
		ts = 2;
		if (sc->flag & SCONV_FROM_UTF16LE)
			always_replace = 0;
	} else if (sc->flag & SCONV_TO_UTF8) {
		unparse = unicode_to_utf8;
		if (sc->flag & SCONV_FROM_UTF8)
			always_replace = 0;
	} else {
		/*
		 * This case is going to be converted to another
		 * character-set through iconv.
		 */
		always_replace = 0;
		if (sc->flag & SCONV_FROM_UTF16BE) {
			unparse = unicode_to_utf16be;
			ts = 2;
		} else if (sc->flag & SCONV_FROM_UTF16LE) {
			unparse = unicode_to_utf16le;
			ts = 2;
		} else {
			unparse = unicode_to_utf8;
		}
	}

	if (sc->flag & SCONV_FROM_UTF16BE) {
		parse = utf16be_to_unicode;
		tm = 1;
		spair = 4;/* surrogate pair size in UTF-16. */
	} else if (sc->flag & SCONV_FROM_UTF16LE) {
		parse = utf16le_to_unicode;
		tm = 1;
		spair = 4;/* surrogate pair size in UTF-16. */
	} else {
		parse = cesu8_to_unicode;
		tm = ts;
		spair = 6;/* surrogate pair size in UTF-8. */
	}

	if (archive_string_ensure(as, as->length + len * tm + ts) == NULL)
		return (-1);

	p = as->s + as->length;
	endp = as->s + as->buffer_length - ts;
	while ((n = parse(&uc, s, len)) != 0) {
		const char *ucptr, *uc2ptr;

		if (n < 0) {
			/* Use a replaced unicode character. */
			UNPARSE(p, endp, uc);
			s += n*-1;
			len -= n*-1;
			ret = -1;
			continue;
		} else if (n == spair || always_replace)
			/* uc is converted from a surrogate pair.
			 * this should be treated as a changed code. */
			ucptr = NULL;
		else
			ucptr = s;
		s += n;
		len -= n;

		/* Read second code point. */
		while ((n2 = parse(&uc2, s, len)) > 0) {
			uint32_t ucx[FDC_MAX];
			int ccx[FDC_MAX];
			int cl, cx, i, nx, ucx_size;
			int LIndex,SIndex;
			uint32_t nfc;

			if (n2 == spair || always_replace)
				/* uc2 is converted from a surrogate pair.
			 	 * this should be treated as a changed code. */
				uc2ptr = NULL;
			else
				uc2ptr = s;
			s += n2;
			len -= n2;

			/*
			 * If current second code point is out of decomposable
			 * code points, finding compositions is unneeded.
			 */
			if (!IS_DECOMPOSABLE_BLOCK(uc2)) {
				WRITE_UC();
				REPLACE_UC_WITH_UC2();
				continue;
			}

			/*
			 * Try to combine current code points.
			 */
			/*
			 * We have to combine Hangul characters according to
			 * http://uniicode.org/reports/tr15/#Hangul
			 */
			if (0 <= (LIndex = uc - HC_LBASE) &&
			    LIndex < HC_LCOUNT) {
				/*
				 * Hangul Composition.
				 * 1. Two current code points are L and V.
				 */
				int VIndex = uc2 - HC_VBASE;
				if (0 <= VIndex && VIndex < HC_VCOUNT) {
					/* Make syllable of form LV. */
					UPDATE_UC(HC_SBASE +
					    (LIndex * HC_VCOUNT + VIndex) *
					     HC_TCOUNT);
				} else {
					WRITE_UC();
					REPLACE_UC_WITH_UC2();
				}
				continue;
			} else if (0 <= (SIndex = uc - HC_SBASE) &&
			    SIndex < HC_SCOUNT && (SIndex % HC_TCOUNT) == 0) {
				/*
				 * Hangul Composition.
				 * 2. Two current code points are LV and T.
				 */
				int TIndex = uc2 - HC_TBASE;
				if (0 < TIndex && TIndex < HC_TCOUNT) {
					/* Make syllable of form LVT. */
					UPDATE_UC(uc + TIndex);
				} else {
					WRITE_UC();
					REPLACE_UC_WITH_UC2();
				}
				continue;
			} else if ((nfc = get_nfc(uc, uc2)) != 0) {
				/* A composition to current code points
				 * is found. */
				UPDATE_UC(nfc);
				continue;
			} else if ((cl = CCC(uc2)) == 0) {
				/* Clearly 'uc2' the second code point is not
				 * a decomposable code. */
				WRITE_UC();
				REPLACE_UC_WITH_UC2();
				continue;
			}

			/*
			 * Collect following decomposable code points.
			 */
			cx = 0;
			ucx[0] = uc2;
			ccx[0] = cl;
			COLLECT_CPS(1);

			/*
			 * Find a composed code in the collected code points.
			 */
			i = 1;
			while (i < ucx_size) {
				int j;

				if ((nfc = get_nfc(uc, ucx[i])) == 0) {
					i++;
					continue;
				}

				/*
				 * nfc is composed of uc and ucx[i].
				 */
				UPDATE_UC(nfc);

				/*
				 * Remove ucx[i] by shifting
				 * following code points.
				 */
				for (j = i; j+1 < ucx_size; j++) {
					ucx[j] = ucx[j+1];
					ccx[j] = ccx[j+1];
				}
				ucx_size --;

				/*
				 * Collect following code points blocked
				 * by ucx[i] the removed code point.
				 */
				if (ucx_size > 0 && i == ucx_size &&
				    nx > 0 && cx == cl) {
					cl =  ccx[ucx_size-1];
					COLLECT_CPS(ucx_size);
				}
				/*
				 * Restart finding a composed code with
				 * the updated uc from the top of the
				 * collected code points.
				 */
				i = 0;
			}

			/*
			 * Apparently the current code points are not
			 * decomposed characters or already composed.
			 */
			WRITE_UC();
			for (i = 0; i < ucx_size; i++)
				UNPARSE(p, endp, ucx[i]);

			/*
			 * Flush out remaining canonical combining characters.
			 */
			if (nx > 0 && cx == cl && len > 0) {
				while ((nx = parse(&ucx[0], s, len))
				    > 0) {
					cx = CCC(ucx[0]);
					if (cl > cx)
						break;
					s += nx;
					len -= nx;
					cl = cx;
					UNPARSE(p, endp, ucx[0]);
				}
			}
			break;
		}
		if (n2 < 0) {
			WRITE_UC();
			/* Use a replaced unicode character. */
			UNPARSE(p, endp, uc2);
			s += n2*-1;
			len -= n2*-1;
			ret = -1;
			continue;
		} else if (n2 == 0) {
			WRITE_UC();
			break;
		}
	}
	as->length = p - as->s;
	as->s[as->length] = '\0';
	if (ts == 2)
		as->s[as->length+1] = '\0';
	return (ret);
}